

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_archive.cpp
# Opt level: O0

bool ReadBase(ON_BinaryArchive *archive,ON_SubDComponentBase *base)

{
  bool bVar1;
  int iVar2;
  double local_88;
  double deprecated_and_never_used_V_1 [3];
  uchar sz;
  double deprecated_and_never_used_V [3];
  double local_48;
  double P [3];
  ON__UINT32 local_28;
  uchar deprecated_and_never_used_char;
  uchar cP;
  unsigned_short level;
  uint id;
  uint archive_id;
  ON_SubDComponentBase *base_local;
  ON_BinaryArchive *archive_local;
  
  _deprecated_and_never_used_char = 0;
  local_28 = 0;
  P[2]._6_2_ = 0;
  _id = base;
  base_local = (ON_SubDComponentBase *)archive;
  bVar1 = ON_BinaryArchive::ReadInt(archive,(ON__UINT32 *)&deprecated_and_never_used_char);
  if (((bVar1) &&
      (bVar1 = ON_BinaryArchive::ReadInt((ON_BinaryArchive *)base_local,&local_28), bVar1)) &&
     (bVar1 = ON_BinaryArchive::ReadShort
                        ((ON_BinaryArchive *)base_local,(ON__UINT16 *)((long)P + 0x16)), bVar1)) {
    _id->m_id = local_28;
    ON_SubDComponentBase::SetArchiveId(_id,_deprecated_and_never_used_char);
    ON_SubDComponentBase::SetSubdivisionLevel(_id,(uint)P[2]._6_2_);
    iVar2 = ON_BinaryArchive::Archive3dmVersion((ON_BinaryArchive *)base_local);
    if (iVar2 < 0x46) {
      P[2]._5_1_ = '\0';
      P[2]._4_1_ = '\0';
      bVar1 = ON_BinaryArchive::ReadChar
                        ((ON_BinaryArchive *)base_local,(ON__UINT8 *)((long)P + 0x15));
      if ((bVar1) &&
         ((((P[2]._5_1_ == '\0' ||
            (bVar1 = Internal_ReadDouble3((ON_BinaryArchive *)base_local,&local_48), bVar1)) &&
           (bVar1 = ON_BinaryArchive::ReadChar
                              ((ON_BinaryArchive *)base_local,(ON__UINT8 *)((long)P + 0x14)), bVar1)
           ) && ((P[2]._4_1_ == '\0' ||
                 (bVar1 = Internal_ReadDouble3
                                    ((ON_BinaryArchive *)base_local,
                                     (double *)&stack0xffffffffffffff98), bVar1)))))) {
        if (P[2]._5_1_ == '\x04') {
          ON_SubDComponentBase::SetSavedSubdivisionPoint(_id,&local_48);
        }
        return true;
      }
    }
    else {
      deprecated_and_never_used_V_1[2]._7_1_ = '\0';
      bVar1 = Internal_ReadComponentAdditionSize
                        ((ON_BinaryArchive *)base_local,'\x18',
                         (uchar *)((long)deprecated_and_never_used_V_1 + 0x17));
      if (bVar1) {
        if (deprecated_and_never_used_V_1[2]._7_1_ == -1) {
          return true;
        }
        if (deprecated_and_never_used_V_1[2]._7_1_ != '\0') {
          memset(&local_88,0,0x18);
          bVar1 = ON_BinaryArchive::ReadDouble((ON_BinaryArchive *)base_local,3,&local_88);
          if (!bVar1) goto LAB_008c0f50;
        }
        deprecated_and_never_used_V_1[2]._7_1_ = '\0';
        bVar1 = Internal_ReadComponentAdditionSize
                          ((ON_BinaryArchive *)base_local,'\x04',
                           (uchar *)((long)deprecated_and_never_used_V_1 + 0x17));
        if (bVar1) {
          if (deprecated_and_never_used_V_1[2]._7_1_ == -1) {
            return true;
          }
          if ((deprecated_and_never_used_V_1[2]._7_1_ == '\0') ||
             (bVar1 = ON_BinaryArchive::ReadInt((ON_BinaryArchive *)base_local,&_id->m_group_id),
             bVar1)) {
            deprecated_and_never_used_V_1[2]._7_1_ = '\0';
            bVar1 = Internal_ReadComponentAdditionSize
                              ((ON_BinaryArchive *)base_local,'\x05',
                               (uchar *)((long)deprecated_and_never_used_V_1 + 0x17));
            if (bVar1) {
              if (deprecated_and_never_used_V_1[2]._7_1_ == -1) {
                return true;
              }
              if ((deprecated_and_never_used_V_1[2]._7_1_ == '\0') ||
                 (bVar1 = Internal_ReadSymmetrySetNext((ON_BinaryArchive *)base_local,_id), bVar1))
              {
                bVar1 = Internal_FinishReadingComponentAdditions((ON_BinaryArchive *)base_local);
                return bVar1;
              }
            }
          }
        }
      }
    }
  }
LAB_008c0f50:
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

static bool ReadBase(
  ON_BinaryArchive& archive,
  ON_SubDComponentBase& base
  )
{
  unsigned int archive_id = 0;
  unsigned int id = 0;
  unsigned short level = 0;
  for (;;)
  {
    if (!archive.ReadInt(&archive_id))
      break;
    if (!archive.ReadInt(&id))
      break;
    if (!archive.ReadShort(&level))
      break;

    base.m_id = id;
    base.SetArchiveId(archive_id);
    base.SetSubdivisionLevel(level);

    if (archive.Archive3dmVersion() < 70)
    {
      unsigned char cP = 0U;
      unsigned char deprecated_and_never_used_char = 0U;
      double P[3];

      if (!archive.ReadChar(&cP))
        break;
      if (0 != cP)
      {
        if (!Internal_ReadDouble3(archive, P))
          break;
      }

      if (!archive.ReadChar(&deprecated_and_never_used_char))
        break;
      if (0 != deprecated_and_never_used_char)
      {
        double deprecated_and_never_used_V[3];
        if (!Internal_ReadDouble3(archive, deprecated_and_never_used_V))
          break;
      }
      if (4 == cP)
        base.SetSavedSubdivisionPoint(P);
      return true;
    }

    // read additions
    unsigned char sz;

    // 24 byte displacement addition
    // This addition was a deprecated prototype that was never used in commercial Rhino.
    sz = 0;
    if (false == Internal_ReadComponentAdditionSize(archive, 24, &sz))
      break;
    if (ON_SubDComponentArchiveAdditionEndMark == sz)
      return true; // end of additions
    if (0 != sz)
    {
      double deprecated_and_never_used_V[3] = {};
      if (!archive.ReadDouble(3, deprecated_and_never_used_V))
        break;
    }

    // 4 byte group id addition
    sz = 0;
    if (false == Internal_ReadComponentAdditionSize(archive, 4, &sz))
      break;
    if (ON_SubDComponentArchiveAdditionEndMark == sz)
      return true; // end of additions
    if (0 != sz)
    {
      if (!archive.ReadInt(&base.m_group_id))
        break;
    }

    // 5 bytes symmetry set next addition Dec 2020 Rhino 7.2 and later
    // 5 bytes = unsigned archive id + char flags
    sz = 0;
    if (false == Internal_ReadComponentAdditionSize(archive, 5, &sz))
      break;
    if (ON_SubDComponentArchiveAdditionEndMark == sz)
      return true; // end of additions
    if (0 != sz)
    {
      if (!Internal_ReadSymmetrySetNext(archive,base))
        break;
    }

    
    return Internal_FinishReadingComponentAdditions(archive);
  }

  return ON_SUBD_RETURN_ERROR(false);
}